

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  sColMap *psVar1;
  sqlite3 *db;
  Table *pTVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  FKey *data;
  FKey *pFVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  sColMap *z;
  undefined1 *puVar12;
  undefined1 *pTo_00;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  
  db = pParse->db;
  pTVar2 = pParse->pNewTable;
  if ((pTVar2 != (Table *)0x0) && (pParse->eParseMode != '\x01')) {
    if (pFromCol == (ExprList *)0x0) {
      if (0 < pTVar2->nCol) {
        uVar8 = 1;
        if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == 1)) goto LAB_00169409;
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar2->aCol[(ushort)pTVar2->nCol - 1].zName,pTo);
      }
    }
    else {
      uVar8 = (ulong)(uint)pFromCol->nExpr;
      if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == pFromCol->nExpr)) {
LAB_00169409:
        iVar3 = (int)uVar8;
        iVar13 = iVar3 * 0x10 + pTo->n + 0x41;
        if (pToCol != (ExprList *)0x0) {
          uVar11 = 0;
          uVar10 = (ulong)(uint)pToCol->nExpr;
          if (pToCol->nExpr < 1) {
            uVar10 = uVar11;
          }
          for (; uVar10 * 0x20 != uVar11; uVar11 = uVar11 + 0x20) {
            iVar4 = sqlite3Strlen30(*(char **)((long)&pToCol->a[0].zName + uVar11));
            iVar13 = iVar13 + iVar4 + 1;
          }
        }
        data = (FKey *)sqlite3DbMallocZero(db,(long)iVar13);
        if (data != (FKey *)0x0) {
          data->pFrom = pTVar2;
          data->pNextFrom = pTVar2->pFKey;
          z = data->aCol + iVar3;
          data->zTo = (char *)z;
          if (1 < pParse->eParseMode) {
            sqlite3RenameTokenMap(pParse,z,pTo);
          }
          psVar1 = data->aCol;
          memcpy(z,pTo->z,(ulong)pTo->n);
          *(undefined1 *)((long)&z->iFrom + (ulong)pTo->n) = 0;
          sqlite3Dequote((char *)z);
          uVar6 = pTo->n;
          data->nCol = iVar3;
          if (pFromCol == (ExprList *)0x0) {
            psVar1->iFrom = pTVar2->nCol + -1;
          }
          else {
            uVar10 = 0;
            if (0 < iVar3) {
              uVar10 = uVar8;
            }
            for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
              uVar5 = (uint)(ushort)pTVar2->nCol;
              if (pTVar2->nCol < 1) {
                uVar5 = 0;
              }
              lVar9 = 0;
              uVar14 = 0;
              while( true ) {
                if (uVar5 == uVar14) {
                  sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                                  pFromCol->a[uVar11 & 0xffffffff].zName);
                  goto LAB_0016939a;
                }
                pcVar15 = pFromCol->a[uVar11].zName;
                iVar13 = sqlite3StrICmp(*(char **)((long)&pTVar2->aCol->zName + lVar9),pcVar15);
                if (iVar13 == 0) break;
                uVar14 = uVar14 + 1;
                lVar9 = lVar9 + 0x20;
              }
              psVar1[uVar11].iFrom = (int)uVar14;
              if (1 < pParse->eParseMode) {
                sqlite3RenameTokenRemap(pParse,psVar1 + uVar11,pcVar15);
              }
            }
          }
          if (pToCol != (ExprList *)0x0) {
            pTo_00 = (undefined1 *)((long)&z->iFrom + (ulong)(uVar6 + 1));
            uVar10 = 0;
            if (iVar3 < 1) {
              uVar8 = uVar10;
            }
            for (; uVar8 << 4 != uVar10; uVar10 = uVar10 + 0x10) {
              pcVar15 = *(char **)((long)&pToCol->a[0].zName + uVar10 * 2);
              uVar6 = sqlite3Strlen30(pcVar15);
              *(undefined1 **)((long)&data->aCol[0].zCol + uVar10) = pTo_00;
              if (1 < pParse->eParseMode) {
                sqlite3RenameTokenRemap(pParse,pTo_00,pcVar15);
                pcVar15 = *(char **)((long)&pToCol->a[0].zName + uVar10 * 2);
              }
              memcpy(pTo_00,pcVar15,(ulong)uVar6);
              puVar12 = pTo_00 + uVar6;
              pTo_00 = puVar12 + 1;
              *puVar12 = 0;
            }
          }
          data->isDeferred = '\0';
          data->aAction[0] = (u8)flags;
          data->aAction[1] = (u8)((uint)flags >> 8);
          pFVar7 = (FKey *)sqlite3HashInsert(&pTVar2->pSchema->fkeyHash,data->zTo,data);
          if (pFVar7 == data) {
            sqlite3OomFault(db);
            goto LAB_0016939a;
          }
          if (pFVar7 != (FKey *)0x0) {
            data->pNextTo = pFVar7;
            pFVar7->pPrevTo = data;
          }
          pTVar2->pFKey = data;
        }
      }
      else {
        sqlite3ErrorMsg(pParse,
                        "number of columns in foreign key does not match the number of columns in the referenced table"
                       );
      }
    }
  }
  data = (FKey *)0x0;
LAB_0016939a:
  sqlite3DbFree(db,data);
  sqlite3ExprListDelete(db,pFromCol);
  sqlite3ExprListDelete(db,pToCol);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  int nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  pFKey->pNextFrom = p->pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenMap(pParse, (void*)z, pTo);
  }
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zName, pFromCol->a[i].zName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse, 
          "unknown column \"%s\" in foreign key definition", 
          pFromCol->a[i].zName);
        goto fk_end;
      }
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, &pFKey->aCol[i], pFromCol->a[i].zName);
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zName);
      pFKey->aCol[i].zCol = z;
      if( IN_RENAME_OBJECT ){
        sqlite3RenameTokenRemap(pParse, z, pToCol->a[i].zName);
      }
      memcpy(z, pToCol->a[i].zName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash, 
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    sqlite3OomFault(db);
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  p->pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}